

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O1

option_group_definition * __thiscall
VW::config::option_group_definition::add<std::__cxx11::string>
          (option_group_definition *this,
          typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *op)

{
  undefined1 local_39;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  shared_ptr<VW::config::base_option> local_28;
  
  local_38 = (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<VW::config::typed_option<std::__cxx11::string>,std::allocator<VW::config::typed_option<std::__cxx11::string>>,VW::config::typed_option<std::__cxx11::string>&>
            (&_Stack_30,&local_38,
             (allocator<VW::config::typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_39,op);
  local_28.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_38->super_base_option;
  local_28.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Stack_30._M_pi;
  local_38 = (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  vector<std::shared_ptr<VW::config::base_option>,std::allocator<std::shared_ptr<VW::config::base_option>>>
  ::emplace_back<std::shared_ptr<VW::config::base_option>>
            ((vector<std::shared_ptr<VW::config::base_option>,std::allocator<std::shared_ptr<VW::config::base_option>>>
              *)&this->m_options,&local_28);
  if (local_28.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
  }
  return this;
}

Assistant:

option_group_definition& add(typed_option<T> op)
  {
    m_options.push_back(std::make_shared<typed_option<T>>(op));
    return *this;
  }